

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result wabt::ReadBinary(void *data,size_t size,BinaryReaderDelegate *delegate,
                       ReadBinaryOptions *options)

{
  bool bVar1;
  Result RVar2;
  int iVar3;
  Enum EVar4;
  char *format;
  uint16_t layer;
  uint16_t version;
  ReadSectionsOptions local_12d;
  uint32_t magic;
  BinaryReader reader;
  
  reader.state_.offset = 0;
  reader.read_end_ = size;
  reader.state_.data = (uint8_t *)data;
  reader.state_.size = size;
  BinaryReaderLogging::BinaryReaderLogging(&reader.logging_delegate_,options->log_stream,delegate);
  reader.delegate_ = &reader.logging_delegate_.super_BinaryReaderDelegate;
  if (options->log_stream == (Stream *)0x0) {
    reader.delegate_ = delegate;
  }
  reader.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reader.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reader.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reader.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reader.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reader.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reader.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reader.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reader.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reader.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reader.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reader.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reader.catches_.super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reader.catches_.super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reader.catches_.super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reader.last_known_section_ = Invalid;
  reader.did_read_names_section_ = false;
  reader.reading_custom_section_ = false;
  reader.num_func_imports_ = 0;
  reader.num_table_imports_ = 0;
  reader.num_memory_imports_ = 0;
  reader.num_global_imports_ = 0;
  reader.num_tag_imports_ = 0;
  reader.num_function_signatures_ = 0;
  reader.num_function_bodies_ = 0;
  reader.num_data_segments_ = 0;
  reader.data_count_ = 0xffffffff;
  reader.options_ = options;
  (*delegate->_vptr_BinaryReaderDelegate[3])(delegate,&reader.state_);
  bVar1 = options->stop_on_first_error;
  magic = 0;
  RVar2 = anon_unknown_26::BinaryReader::ReadT<unsigned_int>(&reader,&magic,"uint32_t","magic");
  EVar4 = Error;
  if (RVar2.enum_ == Error) goto LAB_00110f71;
  if (magic == 0x6d736100) {
    version = 0;
    layer = 0;
    RVar2 = anon_unknown_26::BinaryReader::ReadU16(&reader,&version,"version");
    EVar4 = Error;
    if (RVar2.enum_ == Error) goto LAB_00110f71;
    RVar2 = anon_unknown_26::BinaryReader::ReadU16(&reader,&layer,"layer");
    if (RVar2.enum_ == Error) goto LAB_00110f71;
    if (layer == 1) {
      format = "wasm components are not yet supported in this tool";
    }
    else {
      if (layer != 0) {
        anon_unknown_26::BinaryReader::PrintError(&reader,"unsupported wasm layer: %#x");
        goto LAB_00110f71;
      }
      if (version != 1) {
        EVar4 = Error;
        anon_unknown_26::BinaryReader::PrintError
                  (&reader,"bad wasm file version: %#x (expected %#x)",(ulong)version,1);
        goto LAB_00110f71;
      }
      EVar4 = Error;
      iVar3 = (*(reader.delegate_)->_vptr_BinaryReaderDelegate[4])(reader.delegate_,1);
      if (iVar3 == 0) {
        local_12d.stop_on_first_error = bVar1;
        RVar2 = anon_unknown_26::BinaryReader::ReadSections(&reader,&local_12d);
        if (RVar2.enum_ == Error) goto LAB_00110f71;
        if (reader.num_function_signatures_ == reader.num_function_bodies_) {
          if ((reader.num_data_segments_ == 0) && (1 < reader.data_count_ + 1)) {
            format = "Data section missing but DataCount non-zero";
          }
          else {
            iVar3 = (*(reader.delegate_)->_vptr_BinaryReaderDelegate[5])();
            if (iVar3 == 0) {
              EVar4 = Ok;
              goto LAB_00110f71;
            }
            format = "EndModule callback failed";
          }
        }
        else {
          format = "function signature count != function body count";
        }
      }
      else {
        format = "BeginModule callback failed";
      }
    }
  }
  else {
    format = "bad magic value";
  }
  EVar4 = Error;
  anon_unknown_26::BinaryReader::PrintError(&reader,format);
LAB_00110f71:
  std::_Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>::~_Vector_base
            (&reader.catches_.
              super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&reader.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
  ;
  std::_Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::~_Vector_base
            (&reader.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
            (&reader.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
            (&reader.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>);
  return (Result)EVar4;
}

Assistant:

BinaryReader::BinaryReader(const void* data,
                           size_t size,
                           BinaryReaderDelegate* delegate,
                           const ReadBinaryOptions& options)
    : read_end_(size),
      state_(static_cast<const uint8_t*>(data), size),
      logging_delegate_(options.log_stream, delegate),
      delegate_(options.log_stream ? &logging_delegate_ : delegate),
      options_(options),
      last_known_section_(BinarySection::Invalid) {
  delegate->OnSetState(&state_);
}